

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O3

hash_t Js::SameValueComparerCommon<void_*,_true>::GetHashCode(Var i)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  hash_t hVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptString *this_00;
  char16 *pcVar10;
  ulong uVar11;
  char *message;
  char *error;
  uint uVar12;
  uint lineNumber;
  double d;
  
  if (i == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cd6940;
    *puVar8 = 0;
LAB_00cd6658:
    this = UnsafeVarTo<Js::RecyclableObject>(i);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00cd6940;
      *puVar8 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00cd6940;
      *puVar8 = 0;
    }
    switch(TVar1) {
    case TypeIds_FirstNumberType:
      bVar4 = ((ulong)i & 0xffff000000000000) == 0x1000000000000;
      goto LAB_00cd686f;
    case TypeIds_Number:
switchD_00cd6747_caseD_4:
      if ((ulong)i >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar4) goto LAB_00cd6940;
        *puVar8 = 0;
      }
      d = (double)((ulong)i ^ 0xfffc000000000000);
      goto LAB_00cd691d;
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
      pJVar9 = VarTo<Js::JavascriptTypedNumber<long>>(i);
      lVar2 = pJVar9->m_value;
      d = (double)lVar2;
      if (lVar2 != (long)d) {
        return (uint)((ulong)lVar2 >> 0x20) ^ (uint)lVar2;
      }
      goto LAB_00cd691d;
    case TypeIds_String:
      this_00 = UnsafeVarTo<Js::JavascriptString>(i);
      pcVar10 = JavascriptString::GetString(this_00);
      cVar6 = JavascriptString::GetLength(this_00);
      if (cVar6 == 0) {
        uVar12 = 0x811c9dc5;
      }
      else {
        uVar12 = 0x811c9dc5;
        uVar11 = 0;
        do {
          uVar12 = ((ushort)pcVar10[uVar11] ^ uVar12) * 0x1000193;
          uVar11 = uVar11 + 1;
        } while (cVar6 != uVar11);
      }
      break;
    default:
      uVar12 = (uint)((ulong)i >> 4);
    }
    return uVar12;
  }
  if (((ulong)i & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)i & 0xffff000000000000) != 0x1000000000000) {
    bVar4 = true;
    if (((ulong)i & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)i >> 0x32 == 0) goto LAB_00cd6658;
      goto switchD_00cd6747_caseD_4;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00cd6940;
    *puVar8 = 0;
    bVar4 = true;
  }
LAB_00cd686f:
  if ((bool)(bVar4 ^ 1U | ((ulong)i & 0x1ffff00000000) == 0x1000000000000)) {
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      error = "(Is(aValue))";
      message = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x43;
      goto LAB_00cd6906;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00cd6906:
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,message);
    if (!bVar4) {
LAB_00cd6940:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  d = (double)(int)i;
LAB_00cd691d:
  hVar7 = HashDouble(d);
  return hVar7;
}

Assistant:

static hash_t GetHashCode(Var i)
        {
            switch (JavascriptOperators::GetTypeId(i))
            {
            case TypeIds_Integer:
                // int32 can be fully represented in a double, so hash it as a double
                // to ensure that tagged ints hash to the same value as JavascriptNumbers.
                return HashDouble((double)TaggedInt::ToInt32(i));

            case TypeIds_Int64Number:
            case TypeIds_UInt64Number:
                {
                    __int64 v = VarTo<JavascriptInt64Number>(i)->GetValue();
                    double d = (double) v;
                    if (v != (__int64) d)
                    {
                        // this int64 is too large to represent in a double
                        // and thus will never be equal to a double so hash it
                        // as an int64
                        return (uint)v ^ (uint)(v >> 32);
                    }

                    // otherwise hash it as a double
                    return HashDouble(d);
                }

            case TypeIds_Number:
                {
                    double d = JavascriptNumber::GetValue(i);
                    return HashDouble(d);
                }

            case TypeIds_String:
                {
                    JavascriptString* v = UnsafeVarTo<JavascriptString>(i);
                    return JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(v->GetString(), v->GetLength());
                }

            default:
                return RecyclerPointerComparer<Var>::GetHashCode(i);
            }
        }